

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::quadratic_cost_type<double>::make_l2_norm(quadratic_cost_type<double> *this,int n)

{
  double *pdVar1;
  double *pdVar2;
  quad *pqVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar19 [64];
  
  if (n == 0) {
    auVar21 = ZEXT1664(ZEXT816(0));
  }
  else {
    auVar21 = ZEXT1664(ZEXT816(0));
    uVar12 = 0;
    do {
      auVar22._8_8_ = 0;
      auVar22._0_8_ =
           (this->linear_elements)._M_t.
           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl[uVar12];
      uVar12 = uVar12 + 1;
      auVar22 = vfmadd231sd_fma(auVar21._0_16_,auVar22,auVar22);
      auVar21 = ZEXT1664(auVar22);
    } while ((uint)n != uVar12);
  }
  auVar22 = auVar21._0_16_;
  uVar12 = (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
                        ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl[n];
  if (uVar12 != 0) {
    lVar13 = 0;
    do {
      auVar23._8_8_ = 0;
      auVar23._0_8_ =
           *(ulong *)((long)&((this->quadratic_elements)._M_t.
                              super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                             ._M_head_impl)->factor + lVar13);
      lVar13 = lVar13 + 0x10;
      auVar22 = vfmadd231sd_fma(auVar21._0_16_,auVar23,auVar23);
      auVar21 = ZEXT1664(auVar22);
    } while (uVar12 << 4 != lVar13);
  }
  if ((uint)((auVar22._0_8_ & 0x7fffffffffffffff) + 0xfff0000000000000 >> 0x35) < 0x3ff) {
    if (n != 0) {
      auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      pdVar2 = (this->linear_elements)._M_t.
               super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
      auVar15 = vbroadcastsd_avx512f(auVar22);
      auVar16 = vpbroadcastq_avx512f();
      uVar14 = 0;
      do {
        auVar17 = vpbroadcastq_avx512f();
        auVar17 = vporq_avx512f(auVar17,auVar21);
        uVar11 = vpcmpuq_avx512f(auVar17,auVar16,2);
        pdVar1 = pdVar2 + uVar14;
        auVar17._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * (long)pdVar1[1];
        auVar17._0_8_ = (ulong)((byte)uVar11 & 1) * (long)*pdVar1;
        auVar17._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * (long)pdVar1[2];
        auVar17._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * (long)pdVar1[3];
        auVar17._32_8_ = (ulong)((byte)(uVar11 >> 4) & 1) * (long)pdVar1[4];
        auVar17._40_8_ = (ulong)((byte)(uVar11 >> 5) & 1) * (long)pdVar1[5];
        auVar17._48_8_ = (ulong)((byte)(uVar11 >> 6) & 1) * (long)pdVar1[6];
        auVar17._56_8_ = (uVar11 >> 7) * (long)pdVar1[7];
        auVar17 = vdivpd_avx512f(auVar17,auVar15);
        pdVar1 = pdVar2 + uVar14;
        bVar4 = (bool)((byte)uVar11 & 1);
        bVar5 = (bool)((byte)(uVar11 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar11 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar11 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar11 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar11 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar11 >> 6) & 1);
        *pdVar1 = (double)((ulong)bVar4 * auVar17._0_8_ | (ulong)!bVar4 * (long)*pdVar1);
        pdVar1[1] = (double)((ulong)bVar5 * auVar17._8_8_ | (ulong)!bVar5 * (long)pdVar1[1]);
        pdVar1[2] = (double)((ulong)bVar6 * auVar17._16_8_ | (ulong)!bVar6 * (long)pdVar1[2]);
        pdVar1[3] = (double)((ulong)bVar7 * auVar17._24_8_ | (ulong)!bVar7 * (long)pdVar1[3]);
        pdVar1[4] = (double)((ulong)bVar8 * auVar17._32_8_ | (ulong)!bVar8 * (long)pdVar1[4]);
        pdVar1[5] = (double)((ulong)bVar9 * auVar17._40_8_ | (ulong)!bVar9 * (long)pdVar1[5]);
        pdVar1[6] = (double)((ulong)bVar10 * auVar17._48_8_ | (ulong)!bVar10 * (long)pdVar1[6]);
        pdVar1[7] = (double)((uVar11 >> 7) * auVar17._56_8_ |
                            (ulong)!SUB81(uVar11 >> 7,0) * (long)pdVar1[7]);
        uVar14 = uVar14 + 8;
      } while (((ulong)(uint)n + 7 & 0x1fffffff8) != uVar14);
    }
    if (uVar12 != 0) {
      auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar15 = vpbroadcastq_avx512f(ZEXT816(8));
      pqVar3 = (this->quadratic_elements)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
               .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
               _M_head_impl;
      auVar16 = vbroadcastsd_avx512f(auVar22);
      uVar12 = uVar12 + 7 & 0x1fffffff8;
      auVar17 = vpbroadcastq_avx512f();
      do {
        uVar14 = vpcmpuq_avx512f(auVar21,auVar17,2);
        auVar18 = vpsllq_avx512f(auVar21,4);
        auVar21 = vpaddq_avx512f(auVar21,auVar15);
        uVar12 = uVar12 - 8;
        auVar19 = vgatherqpd_avx512f(pqVar3->factor);
        auVar20._8_8_ = (ulong)((byte)(uVar14 >> 1) & 1) * auVar19._8_8_;
        auVar20._0_8_ = (ulong)((byte)uVar14 & 1) * auVar19._0_8_;
        auVar20._16_8_ = (ulong)((byte)(uVar14 >> 2) & 1) * auVar19._16_8_;
        auVar20._24_8_ = (ulong)((byte)(uVar14 >> 3) & 1) * auVar19._24_8_;
        auVar20._32_8_ = (ulong)((byte)(uVar14 >> 4) & 1) * auVar19._32_8_;
        auVar20._40_8_ = (ulong)((byte)(uVar14 >> 5) & 1) * auVar19._40_8_;
        auVar20._48_8_ = (ulong)((byte)(uVar14 >> 6) & 1) * auVar19._48_8_;
        auVar20._56_8_ = (uVar14 >> 7) * auVar19._56_8_;
        auVar19 = vdivpd_avx512f(auVar20,auVar16);
        vscatterqpd_avx512f(ZEXT864(pqVar3) + auVar18,uVar14,auVar19);
      } while (uVar12 != 0);
    }
  }
  return;
}

Assistant:

void make_l2_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += linear_elements[i] * linear_elements[i];
        ;

        for (int i = 0, e = indices[n]; i != e; ++i)
            div += quadratic_elements[i].factor * quadratic_elements[i].factor;

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }